

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::fail_past_end(void)

{
  char input [1];
  decoder_type decoder;
  value_type local_169 [1];
  value local_168 [2];
  basic_decoder<char> local_160;
  
  local_169[0] = '\0';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<1ul>(&local_160,&local_169);
  local_168[0] = local_160.current.code;
  local_168[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x163,"void basic_suite::fail_past_end()",local_168,local_168 + 1);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_168[0] = local_160.current.code;
  local_168[1] = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x165,"void basic_suite::fail_past_end()",local_168,local_168 + 1);
  return;
}

Assistant:

void fail_past_end()
{
    const char input[] = "";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
}